

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O1

void helper_dc_zva_aarch64(CPUARMState_conflict *env,uint64_t vaddr_in)

{
  uint uVar1;
  uc_struct_conflict2 *puVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  ulong uVar6;
  int iVar7;
  target_ulong addr;
  long lVar8;
  target_ulong addr_00;
  int iVar9;
  uint oi;
  uint uVar10;
  bool bVar11;
  uintptr_t unaff_retaddr;
  void *hostaddr [2];
  void *local_48 [3];
  
  puVar2 = env->uc;
  uVar1 = env[1].usr_regs[4];
  uVar3 = 4 << ((byte)uVar1 & 0x1f);
  lVar8 = (long)(int)uVar3;
  uVar6 = puVar2->init_target_page->mask * -0x100000000 >> 0x20;
  uVar4 = (uint)(((lVar8 + uVar6) - 1) / uVar6);
  if (2 < uVar4) {
    __assert_fail("maxidx <= ARRAY_SIZE(hostaddr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper-a64.c"
                  ,0x44c,"void helper_dc_zva_aarch64(CPUARMState *, uint64_t)");
  }
  addr_00 = -lVar8 & vaddr_in;
  oi = *(byte *)((long)&env->hflags + 3) & 0xf;
  iVar7 = 0;
  do {
    uVar6 = 0;
    uVar10 = 0;
    if (uVar4 != 0) {
      do {
        pvVar5 = tlb_vaddr_to_host_aarch64
                           (env,((long)(puVar2->init_target_page->mask * uVar6 * -0x100000000) >>
                                0x20) + addr_00,MMU_DATA_STORE,oi);
        local_48[uVar6] = pvVar5;
        if (pvVar5 == (void *)0x0) break;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (uVar4 & 3));
      uVar10 = (uint)uVar6;
    }
    if (uVar10 == uVar4) {
      bVar11 = uVar4 == 2;
      if (bVar11) {
        memset(local_48[0],0,puVar2->init_target_page->mask * -0x100000000 >> 0x20);
      }
      memset(local_48[bVar11],0,lVar8 - (int)-((uint)bVar11 * (int)puVar2->init_target_page->mask));
      return;
    }
    helper_ret_stb_mmu_aarch64(env,vaddr_in,'\0',oi,unaff_retaddr);
    if (uVar4 != 0) {
      iVar9 = 0;
      do {
        uVar6 = puVar2->init_target_page->mask;
        addr = (long)-((int)uVar6 * iVar9) + addr_00;
        if (addr != (uVar6 & vaddr_in)) {
          helper_ret_stb_mmu_aarch64(env,addr,'\0',oi,unaff_retaddr);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)uVar4);
    }
    bVar11 = iVar7 != 0;
    iVar7 = iVar7 + 1;
    if (bVar11) {
      if (uVar1 < 0x1e) {
        uVar6 = 1;
        if (1 < uVar3) {
          uVar6 = (ulong)uVar3;
        }
        do {
          helper_ret_stb_mmu_aarch64(env,addr_00,'\0',oi,unaff_retaddr);
          addr_00 = addr_00 + 1;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      return;
    }
  } while( true );
}

Assistant:

void HELPER(dc_zva)(CPUARMState *env, uint64_t vaddr_in)
{
    /*
     * Implement DC ZVA, which zeroes a fixed-length block of memory.
     * Note that we do not implement the (architecturally mandated)
     * alignment fault for attempts to use this on Device memory
     * (which matches the usual QEMU behaviour of not implementing either
     * alignment faults or any memory attribute handling).
     */

    struct uc_struct *uc = env->uc;
    ARMCPU *cpu = env_archcpu(env);
    uint64_t blocklen = 4 << cpu->dcz_blocksize;
    uint64_t vaddr = vaddr_in & ~(blocklen - 1);
    /*
     * Slightly awkwardly, QEMU's TARGET_PAGE_SIZE may be less than
     * the block size so we might have to do more than one TLB lookup.
     * We know that in fact for any v8 CPU the page size is at least 4K
     * and the block size must be 2K or less, but TARGET_PAGE_SIZE is only
     * 1K as an artefact of legacy v5 subpage support being present in the
     * same QEMU executable. So in practice the hostaddr[] array has
     * two entries, given the current setting of TARGET_PAGE_BITS_MIN.
     */
    int maxidx = DIV_ROUND_UP(blocklen, TARGET_PAGE_SIZE);
    void *hostaddr[DIV_ROUND_UP(2 * KiB, 1 << TARGET_PAGE_BITS_MIN)];
    int try, i;
    unsigned mmu_idx = cpu_mmu_index(env, false);
    TCGMemOpIdx oi = make_memop_idx(MO_UB, mmu_idx);

    assert(maxidx <= ARRAY_SIZE(hostaddr));

    for (try = 0; try < 2; try++) {

        for (i = 0; i < maxidx; i++) {
            hostaddr[i] = tlb_vaddr_to_host(env,
                    vaddr + TARGET_PAGE_SIZE * i,
                    1, mmu_idx);
            if (!hostaddr[i]) {
                break;
            }
        }
        if (i == maxidx) {
            /*
             * If it's all in the TLB it's fair game for just writing to;
             * we know we don't need to update dirty status, etc.
             */
            for (i = 0; i < maxidx - 1; i++) {
                memset(hostaddr[i], 0, TARGET_PAGE_SIZE);
            }
            memset(hostaddr[i], 0, blocklen - (i * TARGET_PAGE_SIZE));
            return;
        }
        /*
         * OK, try a store and see if we can populate the tlb. This
         * might cause an exception if the memory isn't writable,
         * in which case we will longjmp out of here. We must for
         * this purpose use the actual register value passed to us
         * so that we get the fault address right.
         */
        helper_ret_stb_mmu(env, vaddr_in, 0, oi, GETPC());
        /* Now we can populate the other TLB entries, if any */
        for (i = 0; i < maxidx; i++) {
            uint64_t va = vaddr + TARGET_PAGE_SIZE * i;
            if (va != (vaddr_in & TARGET_PAGE_MASK)) {
                helper_ret_stb_mmu(env, va, 0, oi, GETPC());
            }
        }
    }

    /*
     * Slow path (probably attempt to do this to an I/O device or
     * similar, or clearing of a block of code we have translations
     * cached for). Just do a series of byte writes as the architecture
     * demands. It's not worth trying to use a cpu_physical_memory_map(),
     * memset(), unmap() sequence here because:
     *  + we'd need to account for the blocksize being larger than a page
     *  + the direct-RAM access case is almost always going to be dealt
     *    with in the fastpath code above, so there's no speed benefit
     *  + we would have to deal with the map returning NULL because the
     *    bounce buffer was in use
     */
    for (i = 0; i < blocklen; i++) {
        helper_ret_stb_mmu(env, vaddr + i, 0, oi, GETPC());
    }
}